

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_drawing.h
# Opt level: O0

void dlib::draw_line(canvas *c,point *p1,point *p2)

{
  long l_;
  long t_;
  long r_;
  long b_;
  rectangle *in_stack_000001b0;
  int *in_stack_000001b8;
  point *in_stack_000001c0;
  point *in_stack_000001c8;
  canvas *in_stack_000001d0;
  rectangle local_40;
  undefined4 local_1c;
  
  local_1c = 0;
  l_ = std::numeric_limits<long>::min();
  t_ = std::numeric_limits<long>::min();
  r_ = std::numeric_limits<long>::max();
  b_ = std::numeric_limits<long>::max();
  rectangle::rectangle(&local_40,l_,t_,r_,b_);
  draw_line<int>(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,
                 in_stack_000001b0);
  return;
}

Assistant:

inline void draw_line (
        const canvas& c,
        const point& p1,
        const point& p2
    ){ draw_line(c,p1,p2,0); }